

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int byte_size_before_serialization;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  if (byte_size_before_serialization <= size) {
    iVar1 = (*this->_vptr_MessageLite[0xb])(this,data);
    lVar2 = CONCAT44(extraout_var,iVar1) - (long)data;
    if (lVar2 != byte_size_before_serialization) {
      iVar1 = (*this->_vptr_MessageLite[9])(this);
      anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar1,(int)lVar2);
    }
  }
  return byte_size_before_serialization <= size;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  int byte_size = ByteSize();
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSize(), end - start);
  }
  return true;
}